

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O1

double __thiscall GaussianEdgeCalculator::sf(GaussianEdgeCalculator *this,double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (0.0 <= x) {
    dVar3 = floor(x / 0.001);
    dVar2 = 0.0;
    uVar1 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
    if (uVar1 < 0x9664) {
      dVar2 = this->cached_survival_function[uVar1];
    }
  }
  else {
    dVar2 = ceil(x / -0.001);
    uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
    if (uVar1 < 0x9664) {
      dVar2 = 1.0 - this->cached_survival_function[uVar1];
    }
    else {
      dVar2 = 1.0;
    }
  }
  return dVar2;
}

Assistant:

double GaussianEdgeCalculator::sf(double x) const {
	if (x>=0.0) {
		size_t i = (size_t)floor(x/SF_CACHE_FACTOR);
		return (i<SF_CACHE_SIZE)?cached_survival_function[i]:0.0;
	} else {
		size_t i = (size_t)ceil(-x/SF_CACHE_FACTOR);
		return (i<SF_CACHE_SIZE)?(1.0-cached_survival_function[i]):1.0;
	}
}